

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_115e484::SpeakerDelegate::SDL_audio_callback
               (void *userdata,Uint8 *stream,int len)

{
  int len_local;
  Uint8 *stream_local;
  void *userdata_local;
  
  audio_callback((SpeakerDelegate *)userdata,stream,len);
  return;
}

Assistant:

static void SDL_audio_callback(void *userdata, Uint8 *stream, int len) {
		reinterpret_cast<SpeakerDelegate *>(userdata)->audio_callback(stream, len);
	}